

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

bool __thiscall helics::Input::checkUpdate(Input *this,bool assumeUpdate)

{
  bool bVar1;
  long lVar2;
  undefined8 *puVar3;
  anon_class_16_2_e880800d visitor;
  data_view dv;
  anon_class_16_2_e880800d local_40;
  data_view local_30;
  
  if (this->changeDetectionEnabled == true) {
    if (!assumeUpdate) {
      bVar1 = helics::ValueFederate::isUpdated(this->fed,this);
      if (!bVar1) goto LAB_002726c8;
    }
    helics::ValueFederate::getBytes(&local_30,this->fed,this);
    if (this->injectionType == HELICS_UNKNOWN) {
      loadSourceInformation(this);
    }
    lVar2 = (long)(char)*(__index_type *)
                         ((long)&(this->lastValue).
                                 super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                                 .
                                 super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                                 .
                                 super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                                 .
                                 super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                                 .
                                 super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                                 .
                                 super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                         + 0x28);
    local_40.this = this;
    local_40.dv = &local_30;
    if (lVar2 == -1) {
      puVar3 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar3 = &PTR__exception_0054ff18;
      puVar3[1] = "std::visit: variant is valueless";
      __cxa_throw(puVar3,&std::bad_variant_access::typeinfo,std::exception::~exception);
    }
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/application_api/Inputs.cpp:552:28)_&,_std::variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>_&>
      ::_S_vtable._M_arr[lVar2]._M_data)(&local_40,&this->lastValue);
    if (local_30.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.ref.
                 super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    bVar1 = true;
    if (!assumeUpdate && this->hasUpdate == false) {
      bVar1 = helics::ValueFederate::isUpdated(this->fed,this);
    }
    this->hasUpdate = bVar1;
  }
LAB_002726c8:
  return this->hasUpdate;
}

Assistant:

bool Input::checkUpdate(bool assumeUpdate)
{
    if (changeDetectionEnabled) {
        if (assumeUpdate || fed->isUpdated(*this)) {
            auto dv = fed->getBytes(*this);
            if (injectionType == DataType::HELICS_UNKNOWN) {
                loadSourceInformation();
            }
            auto visitor = [&, this](auto&& arg) {
                std::remove_reference_t<decltype(arg)> newVal;
                (void)arg;  // suppress VS2015 warning
                if (injectionType == helics::DataType::HELICS_DOUBLE) {
                    defV val = doubleExtractAndConvert(dv, inputUnits, outputUnits);
                    valueExtract(val, newVal);
                } else if (injectionType == helics::DataType::HELICS_INT) {
                    defV val;
                    integerExtractAndConvert(val, dv, inputUnits, outputUnits);
                    valueExtract(val, newVal);
                } else {
                    valueExtract(dv, injectionType, newVal);
                }

                if (changeDetected(lastValue, newVal, delta)) {
                    lastValue = newVal;
                    hasUpdate = true;
                }
            };
            std::visit(visitor, lastValue);
        }
    } else {
        hasUpdate = (hasUpdate || assumeUpdate || fed->isUpdated(*this));
    }
    return hasUpdate;
}